

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextedit.cpp
# Opt level: O1

void QTextEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte *pbVar1;
  InputMethodQuery query;
  long *plVar2;
  QFlagsStorage<Qt::TextInteractionFlag> *pQVar3;
  long lVar4;
  int *piVar5;
  qreal qVar6;
  qreal qVar7;
  undefined1 *puVar8;
  undefined1 *puVar9;
  QString *placeholderText;
  QTextEditPrivate *this;
  undefined1 uVar10;
  __atomic_base<int> _Var11;
  QFlagsStorage<Qt::TextInteractionFlag> QVar12;
  TextInteractionFlags TVar13;
  QTextDocument *pQVar14;
  anon_union_24_3_e3d07ef4_for_data *paVar15;
  int iVar16;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  QArrayData *pQVar17;
  long in_FS_OFFSET;
  float range;
  QVariant in_stack_ffffffffffffff88;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    iVar16 = 0;
    goto LAB_004abb41;
  case 1:
    undoAvailable((QTextEdit *)_o,*_a[1]);
    break;
  case 2:
    redoAvailable((QTextEdit *)_o,*_a[1]);
    break;
  case 3:
    local_58._8_8_ = _a[1];
    paVar15 = &local_58;
    local_58.shared = (PrivateShared *)0x0;
    iVar16 = 3;
    goto LAB_004abb43;
  case 4:
    copyAvailable((QTextEdit *)_o,*_a[1]);
    break;
  case 5:
    iVar16 = 5;
    goto LAB_004abb41;
  case 6:
    iVar16 = 6;
LAB_004abb41:
    paVar15 = (anon_union_24_3_e3d07ef4_for_data *)0x0;
LAB_004abb43:
    QMetaObject::activate(_o,&staticMetaObject,iVar16,&paVar15->shared);
    break;
  case 7:
    setFontPointSize((QTextEdit *)_o,*_a[1]);
    break;
  case 8:
    setFontFamily((QTextEdit *)_o,(QString *)_a[1]);
    break;
  case 9:
    setFontWeight((QTextEdit *)_o,*_a[1]);
    break;
  case 10:
    setFontUnderline((QTextEdit *)_o,*_a[1]);
    break;
  case 0xb:
    setFontItalic((QTextEdit *)_o,*_a[1]);
    break;
  case 0xc:
    setTextColor((QTextEdit *)_o,(QColor *)_a[1]);
    break;
  case 0xd:
    setTextBackgroundColor((QTextEdit *)_o,(QColor *)_a[1]);
    break;
  case 0xe:
    setCurrentFont((QTextEdit *)_o,(QFont *)_a[1]);
    break;
  case 0xf:
    setAlignment((QTextEdit *)_o,
                 (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                 ((QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)_a[1])->
                 super_QFlagsStorage<Qt::AlignmentFlag>);
    break;
  case 0x10:
    lVar4 = *(long *)(_o + 8);
    QWidgetTextControl::setPlainText(*(QWidgetTextControl **)(lVar4 + 0x2f8),(QString *)_a[1]);
    pbVar1 = (byte *)(lVar4 + 800);
    *pbVar1 = *pbVar1 & 0xfd;
    break;
  case 0x11:
    lVar4 = *(long *)(_o + 8);
    QWidgetTextControl::setHtml(*(QWidgetTextControl **)(lVar4 + 0x2f8),(QString *)_a[1]);
    pbVar1 = (byte *)(lVar4 + 800);
    *pbVar1 = *pbVar1 | 2;
    break;
  case 0x12:
    QWidgetTextControl::setMarkdown
              (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),(QString *)_a[1]);
    break;
  case 0x13:
    setText((QTextEdit *)_o,(QString *)_a[1]);
    break;
  case 0x14:
    QWidgetTextControl::cut(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0x15:
    QWidgetTextControl::copy
              (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
               (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,_c),
               (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
    break;
  case 0x16:
    QWidgetTextControl::paste(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),Clipboard);
    break;
  case 0x17:
    QWidgetTextControl::undo(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0x18:
    QWidgetTextControl::redo(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0x19:
    QWidgetTextControl::clear(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0x1a:
    QWidgetTextControl::selectAll(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0x1b:
    QWidgetTextControl::insertPlainText
              (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),(QString *)_a[1]);
    break;
  case 0x1c:
    QWidgetTextControl::insertHtml
              (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),(QString *)_a[1]);
    break;
  case 0x1d:
    append((QTextEdit *)_o,(QString *)_a[1]);
    break;
  case 0x1e:
    scrollToAnchor((QTextEdit *)_o,(QString *)_a[1]);
    break;
  case 0x1f:
    range = (float)*_a[1];
    goto LAB_004abb95;
  case 0x20:
    range = 1.0;
    goto LAB_004abb95;
  case 0x21:
    range = (float)-*_a[1];
    goto LAB_004abb95;
  case 0x22:
    range = -1.0;
LAB_004abb95:
    zoomInF((QTextEdit *)_o,range);
    break;
  case 0x23:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)_o + 0x1c8))(&local_58,_o,*_a[1],_a[2]);
    goto LAB_004ab938;
  case 0x24:
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    query = *_a[1];
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffff88,(QVariant *)_a[2]);
    inputMethodQuery((QVariant *)&local_58,(QTextEdit *)_o,query,in_stack_ffffffffffffff88);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffff88);
LAB_004ab938:
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  if (_c != ReadProperty) {
    if (_c == RegisterPropertyMetaType) {
switchD_004ab89a_caseD_6:
      _Var11._M_i = -1;
      if ((_id == 0xf) &&
         (_Var11._M_i = (__int_type)
                        QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType.typeId.
                        _q_value.super___atomic_base<int>._M_i,
         (__atomic_base<int>)
         QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType.typeId._q_value.
         super___atomic_base<int>._M_i == (__atomic_base<int>)0x0)) {
        _Var11._M_i = QMetaType::registerHelper
                                (&QtPrivate::QMetaTypeInterfaceWrapper<QTextDocument_*>::metaType);
      }
      ((__atomic_base<int> *)*_a)->_M_i = _Var11._M_i;
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_004ab89a_caseD_3;
        goto switchD_004ab89a_caseD_1;
      }
    }
    else {
      if (_c != IndexOfMethod) goto LAB_004abf94;
      plVar2 = (long *)_a[1];
      if (((code *)*plVar2 == textChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_004ab89a_caseD_3;
      }
      if (((code *)*plVar2 == undoAvailable) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_004ab89a_caseD_3;
      }
      if (((code *)*plVar2 == redoAvailable) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_004ab89a_caseD_3;
      }
      if (((code *)*plVar2 == currentCharFormatChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_004ab89a_caseD_3;
      }
      if (((code *)*plVar2 == copyAvailable) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_004ab89a_caseD_3;
      }
      if (((code *)*plVar2 == selectionChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_004ab89a_caseD_3;
      }
      if (((code *)*plVar2 == cursorPositionChanged) && (plVar2[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_004ab89a_caseD_3;
      }
      if (_c == ReadProperty) goto switchD_004ab89a_caseD_1;
      if (_c != WriteProperty) {
        if (_c != RegisterPropertyMetaType) goto switchD_004ab89a_caseD_3;
        goto switchD_004ab89a_caseD_6;
      }
    }
    goto switchD_004ab89a_caseD_2;
  }
switchD_004ab89a_caseD_1:
  if (0x10 < (uint)_id) goto LAB_004abf94;
  pQVar3 = (QFlagsStorage<Qt::TextInteractionFlag> *)*_a;
  switch(_id) {
  case 0:
    QVar12.i = *(Int *)(*(long *)(_o + 8) + 0x300);
    break;
  case 1:
    uVar10 = *(undefined1 *)(*(long *)(_o + 8) + 0x304);
    goto LAB_004abf90;
  case 2:
    documentTitle((QString *)&local_58,(QTextEdit *)_o);
    goto LAB_004abf3a;
  case 3:
    uVar10 = isUndoRedoEnabled((QTextEdit *)_o);
    goto LAB_004abf90;
  case 4:
    QVar12.i = *(Int *)(*(long *)(_o + 8) + 0x314);
    break;
  case 5:
    QVar12.i = *(Int *)(*(long *)(_o + 8) + 0x318);
    break;
  case 6:
    if (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8) == (QWidgetTextControl *)0x0) {
      uVar10 = 1;
    }
    else {
      TVar13 = QWidgetTextControl::textInteractionFlags
                         (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
      uVar10 = ((uint)TVar13.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                      super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0;
    }
    goto LAB_004abf90;
  case 7:
    QWidgetTextControl::toMarkdown
              ((QString *)&local_58,*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
               (MarkdownFeatures)0x104f0c);
    goto LAB_004abf3a;
  case 8:
    QWidgetTextControl::toHtml
              ((QString *)&local_58,*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    goto LAB_004abf3a;
  case 9:
    QWidgetTextControl::toPlainText
              ((QString *)&local_58,*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
LAB_004abf3a:
    pQVar17 = *(QArrayData **)pQVar3;
    *(PrivateShared **)pQVar3 = local_58.shared;
    puVar8 = *(undefined1 **)(pQVar3 + 2);
    *(undefined8 *)(pQVar3 + 2) = local_58._8_8_;
    puVar9 = *(undefined1 **)(pQVar3 + 4);
    *(undefined8 *)(pQVar3 + 4) = local_58._16_8_;
    local_58.shared = (PrivateShared *)pQVar17;
    local_58._8_8_ = puVar8;
    local_58._16_8_ = puVar9;
    if (pQVar17 != (QArrayData *)0x0) {
      LOCK();
      (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
LAB_004abf7d:
        QArrayData::deallocate(pQVar17,2,0x10);
      }
    }
    goto LAB_004abf94;
  case 10:
    uVar10 = QWidgetTextControl::overwriteMode(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    goto LAB_004abf90;
  case 0xb:
    qVar6 = tabStopDistance((QTextEdit *)_o);
    *(qreal *)pQVar3 = qVar6;
    goto LAB_004abf94;
  case 0xc:
    uVar10 = QWidgetTextControl::acceptRichText(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8))
    ;
LAB_004abf90:
    *(undefined1 *)&pQVar3->i = uVar10;
    goto LAB_004abf94;
  case 0xd:
    QVar12.i = QWidgetTextControl::cursorWidth(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0xe:
    QVar12.i = (Int)QWidgetTextControl::textInteractionFlags
                              (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    break;
  case 0xf:
    pQVar14 = QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
    *(QTextDocument **)pQVar3 = pQVar14;
    goto LAB_004abf94;
  case 0x10:
    lVar4 = *(long *)(_o + 8);
    piVar5 = *(int **)(lVar4 + 0x340);
    qVar6 = *(qreal *)(lVar4 + 0x348);
    qVar7 = *(qreal *)(lVar4 + 0x350);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    pQVar17 = *(QArrayData **)pQVar3;
    *(int **)pQVar3 = piVar5;
    *(qreal *)(pQVar3 + 2) = qVar6;
    *(qreal *)(pQVar3 + 4) = qVar7;
    if (pQVar17 == (QArrayData *)0x0) goto LAB_004abf94;
    LOCK();
    (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar17->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar17->ref_)._q_value.super___atomic_base<int>._M_i != 0) goto LAB_004abf94;
    goto LAB_004abf7d;
  }
  pQVar3->i = QVar12.i;
LAB_004abf94:
  if (_c == WriteProperty) {
switchD_004ab89a_caseD_2:
    if ((uint)_id < 0x11) {
      placeholderText = (QString *)*_a;
      switch(_id) {
      case 0:
        *(undefined4 *)(*(long *)(_o + 8) + 0x300) = *(undefined4 *)&(placeholderText->d).d;
        break;
      case 1:
        *(undefined1 *)(*(long *)(_o + 8) + 0x304) = *(undefined1 *)&(placeholderText->d).d;
        break;
      case 2:
        pQVar14 = QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
        QTextDocument::setMetaInformation((MetaInformation)pQVar14,(QString *)0x0);
        break;
      case 3:
        pQVar14 = QWidgetTextControl::document(*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8));
        QTextDocument::setUndoRedoEnabled(SUB81(pQVar14,0));
        break;
      case 4:
        setLineWrapMode((QTextEdit *)_o,*(LineWrapMode *)&(placeholderText->d).d);
        break;
      case 5:
        this = *(QTextEditPrivate **)(_o + 8);
        this->lineWrapColumnOrWidth = *(int *)&(placeholderText->d).d;
        QTextEditPrivate::relayoutDocument(this);
        break;
      case 6:
        setReadOnly((QTextEdit *)_o,*(bool *)&(placeholderText->d).d);
        break;
      case 7:
        QWidgetTextControl::setMarkdown
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),placeholderText);
        break;
      case 8:
        lVar4 = *(long *)(_o + 8);
        QWidgetTextControl::setHtml(*(QWidgetTextControl **)(lVar4 + 0x2f8),placeholderText);
        pbVar1 = (byte *)(lVar4 + 800);
        *pbVar1 = *pbVar1 | 2;
        break;
      case 9:
        lVar4 = *(long *)(_o + 8);
        QWidgetTextControl::setPlainText(*(QWidgetTextControl **)(lVar4 + 0x2f8),placeholderText);
        pbVar1 = (byte *)(lVar4 + 800);
        *pbVar1 = *pbVar1 & 0xfd;
        break;
      case 10:
        QWidgetTextControl::setOverwriteMode
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   *(bool *)&(placeholderText->d).d);
        break;
      case 0xb:
        setTabStopDistance((QTextEdit *)_o,(qreal)(placeholderText->d).d);
        break;
      case 0xc:
        QWidgetTextControl::setAcceptRichText
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   *(bool *)&(placeholderText->d).d);
        break;
      case 0xd:
        QWidgetTextControl::setCursorWidth
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   *(int *)&(placeholderText->d).d);
        break;
      case 0xe:
        QWidgetTextControl::setTextInteractionFlags
                  (*(QWidgetTextControl **)(*(long *)(_o + 8) + 0x2f8),
                   (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                   *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)&(placeholderText->d).d);
        break;
      case 0xf:
        setDocument((QTextEdit *)_o,(QTextDocument *)(placeholderText->d).d);
        break;
      case 0x10:
        setPlaceholderText((QTextEdit *)_o,placeholderText);
      }
    }
  }
switchD_004ab89a_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->setFontPointSize((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setFontFamily((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFontWeight((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->setFontUnderline((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 11: _t->setFontItalic((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->setTextColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 13: _t->setTextBackgroundColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 14: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 15: _t->setAlignment((*reinterpret_cast< std::add_pointer_t<Qt::Alignment>>(_a[1]))); break;
        case 16: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 17: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste(); break;
        case 23: _t->undo(); break;
        case 24: _t->redo(); break;
        case 25: _t->clear(); break;
        case 26: _t->selectAll(); break;
        case 27: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 28: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->scrollToAnchor((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->zoomIn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 32: _t->zoomIn(); break;
        case 33: _t->zoomOut((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 34: _t->zoomOut(); break;
        case 35: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 36: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(const QTextCharFormat & )>(_a, &QTextEdit::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::cursorPositionChanged, 6))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 15:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QTextDocument* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<AutoFormatting>(_v, _t->autoFormatting()); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->tabChangesFocus(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->documentTitle(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 4: *reinterpret_cast<LineWrapMode*>(_v) = _t->lineWrapMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->lineWrapColumnOrWidth(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->toMarkdown(); break;
        case 8: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->toPlainText(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 11: *reinterpret_cast<qreal*>(_v) = _t->tabStopDistance(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 14: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 15: *reinterpret_cast<QTextDocument**>(_v) = _t->document(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoFormatting(*reinterpret_cast<AutoFormatting*>(_v)); break;
        case 1: _t->setTabChangesFocus(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setDocumentTitle(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setLineWrapMode(*reinterpret_cast<LineWrapMode*>(_v)); break;
        case 5: _t->setLineWrapColumnOrWidth(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setMarkdown(*reinterpret_cast<QString*>(_v)); break;
        case 8: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 9: _t->setPlainText(*reinterpret_cast<QString*>(_v)); break;
        case 10: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setTabStopDistance(*reinterpret_cast<qreal*>(_v)); break;
        case 12: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 14: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 15: _t->setDocument(*reinterpret_cast<QTextDocument**>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}